

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_AABBTree.cpp
# Opt level: O2

void Opcode::AABBTree::Walk::Local::_Walk
               (AABBTreeNode *current_node,udword *max_depth,udword *current_depth,
               WalkingCallback callback,void *user_data)

{
  bool bVar1;
  uint uVar2;
  AABBTreeNode *current_node_00;
  ulong uVar3;
  
  if (current_node != (AABBTreeNode *)0x0) {
    uVar2 = *current_depth + 1;
    *current_depth = uVar2;
    if (*max_depth < uVar2) {
      *max_depth = uVar2;
    }
    if (((callback == (WalkingCallback)0x0) ||
        (bVar1 = (*callback)(current_node,*current_depth,user_data), bVar1)) &&
       (current_node_00 = (AABBTreeNode *)(current_node->mPos & 0xfffffffffffffffe),
       current_node_00 != (AABBTreeNode *)0x0)) {
      _Walk(current_node_00,max_depth,current_depth,callback,user_data);
      *current_depth = *current_depth - 1;
      uVar3 = current_node->mPos & 0xfffffffffffffffe;
      if (uVar3 != 0) {
        _Walk((AABBTreeNode *)(uVar3 + 0x30),max_depth,current_depth,callback,user_data);
        *current_depth = *current_depth - 1;
      }
    }
  }
  return;
}

Assistant:

static void _Walk(const AABBTreeNode* current_node, udword& max_depth, udword& current_depth, WalkingCallback callback, void* user_data)
		{
			// Checkings
			if(!current_node)	return;
			// Entering a new node => increase depth
			current_depth++;
			// Keep track of max depth
			if(current_depth>max_depth)	max_depth = current_depth;

			// Callback
			if(callback && !(callback)(current_node, current_depth, user_data))	return;

			// Recurse
			if(current_node->GetPos())	{ _Walk(current_node->GetPos(), max_depth, current_depth, callback, user_data);	current_depth--;	}
			if(current_node->GetNeg())	{ _Walk(current_node->GetNeg(), max_depth, current_depth, callback, user_data);	current_depth--;	}
		}